

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::NullTypeHandlerBase::GetProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  ScriptContext::GetOrAddPropertyRecord
            ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_38);
  BVar1 = GetProperty(this,instance,originalInstance,local_38->pid,value,info,requestContext);
  return BVar1;
}

Assistant:

BOOL NullTypeHandlerBase::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return NullTypeHandlerBase::GetProperty(instance, originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext);
    }